

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  anon_union_264_9_0449b319_for_proto *ftpc_00;
  char cVar1;
  SessionHandle *data;
  undefined8 *puVar2;
  curl_chunk_end_callback p_Var3;
  long lVar4;
  curl_slist *pcVar5;
  long lVar6;
  bool bVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  undefined8 *puVar14;
  curl_slist *item;
  timeval tVar15;
  ftp_conn *ftpc;
  int ftpcode;
  int ftpcode_1;
  ssize_t nread;
  ssize_t nread_1;
  int local_48;
  int local_44;
  long local_40;
  ssize_t local_38;
  
  data = conn->data;
  puVar2 = (undefined8 *)(data->req).protop;
  if (puVar2 == (undefined8 *)0x0) {
    return CURLE_OK;
  }
  pcVar10 = (data->state).path;
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar9 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    (conn->bits).close = true;
    CVar9 = status;
  }
  pcVar13 = (conn->proto).ftpc.prevpath;
  if (pcVar13 != (char *)0x0) {
    (*Curl_cfree)(pcVar13);
  }
  if ((data->set).wildcardmatch == true) {
    p_Var3 = (data->set).chunk_end;
    if ((p_Var3 != (curl_chunk_end_callback)0x0) && ((conn->proto).ftpc.file != (char *)0x0)) {
      (*p_Var3)((data->wildcard).customptr);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  ftpc_00 = &conn->proto;
  pcVar10 = curl_easy_unescape(data,pcVar10,0,(int *)0x0);
  if (pcVar10 == (char *)0x0) {
    if (CVar9 == CURLE_OK) {
      CVar9 = CURLE_OUT_OF_MEMORY;
    }
    (conn->proto).ftpc.ctl_valid = false;
    (conn->bits).close = true;
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  else {
    pcVar13 = (conn->proto).ftpc.file;
    if (pcVar13 == (char *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = strlen(pcVar13);
    }
    sVar12 = strlen(pcVar10);
    if ((conn->proto).ftpc.cwdfail == false) {
      if ((sVar12 == sVar11) || ((data->set).ftp_filemethod == FTPFILE_NOCWD)) {
        pcVar13 = (*Curl_cstrdup)("");
        (conn->proto).ftpc.prevpath = pcVar13;
        (*Curl_cfree)(pcVar10);
      }
      else {
        (conn->proto).ftpc.prevpath = pcVar10;
        if (sVar11 != 0) {
          pcVar10[sVar12 - sVar11] = '\0';
        }
      }
      if ((conn->proto).ftpc.prevpath != (char *)0x0) {
        Curl_infof(data,"Remembering we are in dir \"%s\"\n");
      }
    }
    else {
      (conn->proto).ftpc.prevpath = (char *)0x0;
      (*Curl_cfree)(pcVar10);
    }
  }
  freedirs(&ftpc_00->ftpc);
  if (conn->sock[1] != -1) {
    if (((CVar9 == CURLE_OK) && (CVar9 = CURLE_OK, (conn->proto).ftpc.dont_check == true)) &&
       (0 < (data->req).maxdownload)) {
      CVar8 = Curl_pp_sendf(&(ftpc_00->ftpc).pp,"%s","ABOR");
      CVar9 = CURLE_OK;
      if (CVar8 != CURLE_OK) {
        pcVar10 = curl_easy_strerror(CVar8);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar10);
        (conn->proto).ftpc.ctl_valid = false;
        (conn->bits).close = true;
        CVar9 = CVar8;
      }
    }
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
      conn->sock[1] = -1;
      (conn->bits).tcpconnect[1] = false;
    }
  }
  if (((CVar9 == CURLE_OK) && (CVar9 = CURLE_OK, *(int *)(puVar2 + 3) == 0)) &&
     (((conn->proto).ftpc.ctl_valid == true &&
      (*(char *)((long)&conn->proto + 0x20) == '\x01' && !premature)))) {
    lVar4 = (conn->proto).ftpc.pp.response_time;
    (conn->proto).ftpc.pp.response_time = 60000;
    tVar15 = curlx_tvnow();
    *(timeval *)((long)&conn->proto + 0x40) = tVar15;
    CVar8 = Curl_GetFTPResponse(&local_40,conn,&local_48);
    (conn->proto).ftpc.pp.response_time = lVar4;
    if (CVar8 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
      Curl_failf(data,"control connection looks dead");
      (conn->proto).ftpc.ctl_valid = false;
      (conn->bits).close = true;
    }
    if (CVar8 == CURLE_OK) {
      if ((conn->proto).ftpc.dont_check == true) {
        if ((data->req).maxdownload < 1) {
          bVar7 = true;
          CVar9 = CURLE_OK;
        }
        else {
          bVar7 = false;
          Curl_infof(data,"partial download completed, closing connection\n");
          (conn->bits).close = true;
          CVar9 = CURLE_OK;
        }
      }
      else {
        bVar7 = true;
        CVar9 = CURLE_OK;
        if ((local_48 != 0xe2) && (CVar9 = CURLE_OK, local_48 != 0xfa)) {
          Curl_failf(data,"server did not report OK, got %d");
          CVar9 = CURLE_PARTIAL_FILE;
        }
      }
    }
    else {
      bVar7 = false;
      CVar9 = CVar8;
    }
    if (!bVar7) {
      return CVar8;
    }
  }
  if (CVar9 == CURLE_OK && !premature) {
    if ((data->set).upload == true) {
      lVar4 = (data->state).infilesize;
      CVar9 = CURLE_OK;
      if (((lVar4 == -1) || (lVar4 == *(long *)*puVar2)) ||
         ((CVar9 = CURLE_OK, (data->set).crlf != false || (*(int *)(puVar2 + 3) != 0))))
      goto LAB_00130c0c;
      Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)");
    }
    else {
      lVar4 = (data->req).size;
      if ((((lVar4 == -1) || (lVar6 = *(long *)*puVar2, lVar4 == lVar6)) ||
          ((data->state).crlf_conversions + lVar4 == lVar6)) || ((data->req).maxdownload == lVar6))
      {
        CVar9 = CURLE_OK;
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar4)) && (*(long *)*puVar2 == 0)) {
          Curl_failf(data,"No data was received!");
          CVar9 = CURLE_FTP_COULDNT_RETR_FILE;
        }
        goto LAB_00130c0c;
      }
      Curl_failf(data,"Received only partial file: %ld bytes");
    }
    CVar9 = CURLE_PARTIAL_FILE;
  }
LAB_00130c0c:
  *(undefined4 *)(puVar2 + 3) = 0;
  (conn->proto).ftpc.dont_check = false;
  if ((status != CURLE_OK || CVar9 != CURLE_OK) || premature) {
    return CVar9;
  }
  pcVar5 = (data->set).postquote;
  do {
    if (pcVar5 == (curl_slist *)0x0) {
      return CURLE_OK;
    }
    pcVar10 = pcVar5->data;
    puVar14 = puVar2;
    if (pcVar10 != (char *)0x0) {
      cVar1 = *pcVar10;
      bVar7 = false;
      CVar9 = Curl_pp_sendf(&(ftpc_00->ftpc).pp,"%s",pcVar10 + (cVar1 == '*'));
      puVar14 = (undefined8 *)(ulong)CVar9;
      if (CVar9 == CURLE_OK) {
        tVar15 = curlx_tvnow();
        *(timeval *)((long)&conn->proto + 0x40) = tVar15;
        CVar9 = Curl_GetFTPResponse(&local_38,conn,&local_44);
        if (CVar9 == CURLE_OK) {
          bVar7 = true;
          if (cVar1 == '*') {
            puVar14 = (undefined8 *)((ulong)puVar2 & 0xffffffff);
          }
          else {
            puVar14 = (undefined8 *)((ulong)puVar2 & 0xffffffff);
            if (399 < local_44) {
              bVar7 = false;
              Curl_failf(conn->data,"QUOT string not accepted: %s",pcVar10 + (cVar1 == '*'));
              puVar14 = (undefined8 *)0x15;
            }
          }
        }
        else {
          puVar14 = (undefined8 *)(ulong)CVar9;
          bVar7 = false;
        }
      }
      if (!bVar7) {
        return (CURLcode)puVar14;
      }
    }
    pcVar5 = pcVar5->next;
    puVar2 = puVar14;
  } while( true );
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                              bool premature)
{
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  bool was_ctl_valid = ftpc->ctl_valid;
  char *path;
  const char *path_to_use = data->state.path;

  if(!ftp)
    /* When the easy handle is removed from the multi while libcurl is still
     * trying to resolve the host name, it seems that the ftp struct is not
     * yet initialized, but the removal action calls Curl_done() which calls
     * this function. So we simply return success if no ftp pointer is set.
     */
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature) {
      ftpc->ctl_valid = was_ctl_valid;
      break;
    }
    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  /* now store a copy of the directory we are in */
  if(ftpc->prevpath)
    free(ftpc->prevpath);

  if(data->set.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      data->set.chunk_end(data->wildcard.customptr);
    }
    ftpc->known_filesize = -1;
  }

  /* get the "raw" path */
  path = curl_easy_unescape(data, path_to_use, 0, NULL);
  if(!path) {
    /* out of memory, but we can limp along anyway (and should try to
     * since we may already be in the out of memory cleanup path) */
    if(!result)
      result = CURLE_OUT_OF_MEMORY;
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else {
    size_t flen = ftpc->file?strlen(ftpc->file):0; /* file is "raw" already */
    size_t dlen = strlen(path)-flen;
    if(!ftpc->cwdfail) {
      if(dlen && (data->set.ftp_filemethod != FTPFILE_NOCWD)) {
        ftpc->prevpath = path;
        if(flen)
          /* if 'path' is not the whole string */
          ftpc->prevpath[dlen]=0; /* terminate */
      }
      else {
        /* we never changed dir */
        ftpc->prevpath=strdup("");
        free(path);
      }
      if(ftpc->prevpath)
        infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
    }
    else {
      ftpc->prevpath = NULL; /* no path */
      free(path);
    }
  }
  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET],2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET]) {
      Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
      conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
    }
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_tvnow(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != *ftp->bytecountp) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            *ftp->bytecountp, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != *ftp->bytecountp) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        *ftp->bytecountp) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != *ftp->bytecountp)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", *ftp->bytecountp);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !*ftp->bytecountp &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);

  return result;
}